

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O3

Matrix6x6 * __thiscall
iDynTree::SpatialInertia::biasWrenchDerivative
          (Matrix6x6 *__return_storage_ptr__,SpatialInertia *this,Twist *V)

{
  double *pdVar1;
  undefined8 *puVar2;
  double dVar3;
  undefined8 uVar4;
  PointerType ptr;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_3,_3,_1,_3,_3> mcCrossOmegaCross;
  assign_op<double,_double> local_229;
  undefined1 local_228 [64];
  double local_1e8;
  undefined1 local_1e0 [24];
  double *pdStack_1c8;
  double local_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_1a0;
  Matrix<double,_3,_3,_0,_3,_3> local_198;
  Matrix<double,_3,_3,_0,_3,_3> local_150;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  undefined1 local_c0 [32];
  variable_if_dynamic<long,__1> local_a0;
  variable_if_dynamic<long,__1> local_98;
  Index local_90;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_88;
  
  local_88.m_lhs.m_rhs.m_lhs = (LhsNested)this->m_mcom[0];
  local_88.m_lhs.m_rhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  _8_4_ = SUB84(local_88.m_lhs.m_rhs.m_lhs,0);
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_88;
  local_88._0_8_ = 0;
  local_88.m_lhs.m_rhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)this->m_mcom[1];
  local_88.m_lhs.m_lhs.m_lhs._8_4_ = *(undefined4 *)(this->m_mcom + 2);
  local_88.m_lhs.m_lhs.m_lhs._12_4_ = *(uint *)((long)this->m_mcom + 0x14) ^ 0x80000000;
  local_88.m_lhs.m_lhs.m_lhs.m_xpr = (XprTypeNested)((ulong)this->m_mcom[1] ^ 0x8000000000000000);
  local_88.m_lhs.m_lhs.m_rhs = (RhsNested)0x0;
  local_88.m_lhs.m_rhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  _12_4_ = (uint)((ulong)local_88.m_lhs.m_rhs.m_lhs >> 0x20) ^ 0x80000000;
  local_88.m_lhs._56_8_ = 0;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3
       .super_Vector3.m_data[0];
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  pdVar1 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
           angularVec3.super_Vector3.m_data + 1;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       *pdVar1;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       -*pdVar1;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       -(V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
        angularVec3.super_Vector3.m_data[2];
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       -local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5];
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_1e0._8_8_ = &local_198;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_228._0_8_ = &local_108;
  local_1e0._0_8_ = local_228;
  pdStack_1c8 = (double *)local_228._0_8_;
  local_1e0._16_8_ = local_c0;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_150;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       (double)&local_150;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_1e0);
  dVar3 = this->m_mass;
  local_1e0._8_8_ =
       (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3
       .super_Vector3.m_data[2];
  local_1b8 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
              angularVec3.super_Vector3.m_data[0];
  dStack_1b0 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
               angularVec3.super_Vector3.m_data[1];
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = -(dVar3 * (double)local_1e0._8_8_);
  __return_storage_ptr__->m_data[2] = dVar3 * dStack_1b0;
  __return_storage_ptr__->m_data[6] = dVar3 * (double)local_1e0._8_8_;
  __return_storage_ptr__->m_data[7] = 0.0;
  __return_storage_ptr__->m_data[8] = -(dVar3 * local_1b8);
  __return_storage_ptr__->m_data[0xc] = -(dVar3 * dStack_1b0);
  __return_storage_ptr__->m_data[0xd] = dVar3 * local_1b8;
  __return_storage_ptr__->m_data[0xe] = 0.0;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
       super_Vector3.m_data[2];
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
       super_Vector3.m_data[0];
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
       super_Vector3.m_data[1];
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       this->m_mcom[0];
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       this->m_mcom[1];
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       this->m_mcom[2];
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       -local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       -local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1];
  dVar6 = dStack_1b0 *
          local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] +
          local_1b8 *
          local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2];
  dVar7 = local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6] * (double)local_1e0._8_8_ +
          dStack_1b0 *
          local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3];
  dVar8 = local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] * local_1b8 -
          (double)local_1e0._8_8_ *
          local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5];
  __return_storage_ptr__->m_data[3] = 0.0 - local_108;
  __return_storage_ptr__->m_data[4] =
       (dVar3 * local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] - dVar6) - dStack_f0;
  __return_storage_ptr__->m_data[5] =
       (dVar8 - local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[6] * dVar3) - local_d8;
  __return_storage_ptr__->m_data[9] =
       (dVar6 - dVar3 * local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[1]) - dStack_100;
  __return_storage_ptr__->m_data[10] = 0.0 - local_e8;
  __return_storage_ptr__->m_data[0xb] =
       (dVar3 * local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[5] - dVar7) - local_d0;
  __return_storage_ptr__->m_data[0xf] =
       (local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] * dVar3 - dVar8) - local_f8;
  __return_storage_ptr__->m_data[0x10] =
       (dVar7 - dVar3 * local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[5]) - local_e0;
  __return_storage_ptr__->m_data[0x11] = 0.0 - local_c8;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       -local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5];
  lVar5 = 0x50;
  do {
    uVar4 = *(undefined8 *)
             ((long)local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array + lVar5);
    puVar2 = (undefined8 *)((long)__return_storage_ptr__->m_data + lVar5 * 2 + -0x10);
    *puVar2 = *(undefined8 *)
               ((long)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array + lVar5 + 0x40);
    puVar2[1] = uVar4;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar5 * 2) =
         *(undefined8 *)
          ((long)local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + lVar5 + 8);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x98);
  local_88.m_lhs.m_rhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&this->m_rotInertia;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       -local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5];
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       -local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       -local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1];
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_1a8 = -local_1b8;
  local_1e0._0_8_ = (DstEvaluatorType *)0x0;
  unique0x100004b6 = (int)local_1e0._8_8_;
  local_1e0._16_8_ = -dStack_1b0;
  unique0x100004ba = (uint)((ulong)local_1e0._8_8_ >> 0x20) ^ 0x80000000;
  local_1c0 = 0.0;
  local_1a0 = 0.0;
  dVar6 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
          angularVec3.super_Vector3.m_data[0];
  dVar7 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
          angularVec3.super_Vector3.m_data[1];
  local_228._40_8_ =
       (this->m_rotInertia).super_Matrix3x3.m_data[2] * (double)local_1e0._8_8_ +
       (this->m_rotInertia).super_Matrix3x3.m_data[1] * dVar7 +
       (this->m_rotInertia).super_Matrix3x3.m_data[0] * dVar6;
  local_228._0_8_ = 0.0;
  dVar3 = (double)local_1e0._8_8_ * (this->m_rotInertia).super_Matrix3x3.m_data[5] +
          (this->m_rotInertia).super_Matrix3x3.m_data[4] * dVar7 +
          (this->m_rotInertia).super_Matrix3x3.m_data[3] * dVar6;
  local_228._8_8_ =
       (double)local_1e0._8_8_ * (this->m_rotInertia).super_Matrix3x3.m_data[8] +
       (this->m_rotInertia).super_Matrix3x3.m_data[7] * dVar7 +
       (this->m_rotInertia).super_Matrix3x3.m_data[6] * dVar6;
  local_228._16_8_ = -dVar3;
  local_228._24_8_ = -(double)local_228._8_8_;
  local_228._32_8_ = 0.0;
  local_228._56_4_ = (int)local_228._40_8_;
  local_228._48_8_ = dVar3;
  local_228._60_4_ = (uint)((ulong)local_228._40_8_ >> 0x20) ^ 0x80000000;
  local_1e8 = 0.0;
  local_88.m_lhs.m_lhs.m_rhs = &local_198;
  local_88.m_lhs.m_rhs.m_lhs = (LhsNested)local_1e0;
  local_88.m_rhs = (RhsNested)local_228;
  local_c0._0_8_ = __return_storage_ptr__->m_data + 0x15;
  local_a0.m_value = 3;
  local_98.m_value = 3;
  local_90 = 6;
  local_c0._16_8_ = __return_storage_ptr__;
  local_88.m_lhs.m_lhs.m_lhs.m_xpr = &local_150;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,0>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_c0,&local_88,&local_229);
  return __return_storage_ptr__;
}

Assistant:

Matrix6x6 SpatialInertia::biasWrenchDerivative(const Twist& V) const
{
    Matrix6x6 ret;

    Eigen::Map<const Eigen::Vector3d> linearVel(V.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> angularVel(V.getAngularVec3().data());

    Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(ret.data());

    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > I(this->m_rotInertia.data());

    Eigen::Matrix<double,3,3,Eigen::RowMajor> mcCrossOmegaCross = mySkewIn(mcom)*mySkewIn(angularVel);
    retEigen.block<3,3>(0,0) = mySkewIn(this->m_mass*angularVel);
    retEigen.block<3,3>(0,3) = -mySkewIn(this->m_mass*linearVel) + mySkewIn(mcom.cross(angularVel)) - mcCrossOmegaCross.transpose();
    retEigen.block<3,3>(3,0) = mcCrossOmegaCross;
    retEigen.block<3,3>(3,3) = -mySkewIn(mcom)*mySkewIn(linearVel) + mySkewIn(angularVel)*I - mySkewIn(I*angularVel);

    return ret;
}